

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O2

string * SleighArchitecture::normalizeProcessor(string *__return_storage_ptr__,string *nm)

{
  long lVar1;
  allocator local_11;
  
  lVar1 = std::__cxx11::string::find((char *)nm,0x368f82);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)nm);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"x86",&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

string SleighArchitecture::normalizeProcessor(const string &nm)

{
  if (nm.find("386")!=string::npos)
    return "x86";
  return nm;
}